

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O0

int __thiscall
ABlasterFX1::DoSpecialDamage(ABlasterFX1 *this,AActor *target,int damage,FName *damagetype)

{
  bool bVar1;
  uint uVar2;
  PClass *base;
  FName *damagetype_local;
  int damage_local;
  AActor *target_local;
  ABlasterFX1 *this_local;
  
  base = PClass::FindClass("Ironlich");
  bVar1 = DObject::IsKindOf((DObject *)target,base);
  damagetype_local._4_4_ = damage;
  if (bVar1) {
    uVar2 = FRandom::operator()(&pr_bfx1);
    damagetype_local._4_4_ = uVar2 & 1;
    if (damagetype_local._4_4_ == 0) {
      return -1;
    }
  }
  return damagetype_local._4_4_;
}

Assistant:

int ABlasterFX1::DoSpecialDamage (AActor *target, int damage, FName damagetype)
{
	if (target->IsKindOf (PClass::FindClass ("Ironlich")))
	{ // Less damage to Ironlich bosses
		damage = pr_bfx1() & 1;
		if (!damage)
		{
			return -1;
		}
	}
	return damage;
}